

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

ExceptionOr<kj::Array<unsigned_char>_> * __thiscall
kj::_::ExceptionOr<kj::Array<unsigned_char>_>::operator=
          (ExceptionOr<kj::Array<unsigned_char>_> *this,
          ExceptionOr<kj::Array<unsigned_char>_> *param_1)

{
  ExceptionOr<kj::Array<unsigned_char>_> *param_1_local;
  ExceptionOr<kj::Array<unsigned_char>_> *this_local;
  
  ExceptionOrValue::operator=(&this->super_ExceptionOrValue,&param_1->super_ExceptionOrValue);
  Maybe<kj::Array<unsigned_char>_>::operator=(&this->value,&param_1->value);
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;